

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::SlopesNearCollinear(IntPoint *pt1,IntPoint *pt2,IntPoint *pt3,double distSqrd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  IntPoint *pIVar5;
  IntPoint *ln1;
  IntPoint *pIVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  lVar1 = pt1->X;
  lVar2 = pt1->Y;
  lVar3 = pt2->X;
  uVar7 = lVar1 - lVar3;
  uVar8 = -uVar7;
  if (0 < (long)uVar7) {
    uVar8 = uVar7;
  }
  lVar4 = pt2->Y;
  uVar9 = lVar2 - lVar4;
  uVar7 = -uVar9;
  if (0 < (long)uVar9) {
    uVar7 = uVar9;
  }
  pIVar5 = pt3;
  pIVar6 = pt1;
  if (uVar7 < uVar8) {
    ln1 = pt2;
    if ((lVar3 < lVar1 != pt3->X <= lVar1) ||
       (pIVar5 = pt2, ln1 = pt1, pIVar6 = pt3, lVar1 < lVar3 == pt3->X <= lVar3)) goto LAB_0011a24c;
  }
  else {
    ln1 = pt2;
    if ((lVar4 < lVar2 != pt3->Y <= lVar2) ||
       (pIVar5 = pt2, ln1 = pt1, pIVar6 = pt3, lVar2 < lVar4 == pt3->Y <= lVar4)) goto LAB_0011a24c;
  }
  pIVar5 = pt3;
  ln1 = pt1;
  pIVar6 = pt2;
LAB_0011a24c:
  dVar10 = DistanceFromLineSqrd(pIVar6,ln1,pIVar5);
  return dVar10 < distSqrd;
}

Assistant:

bool SlopesNearCollinear(const IntPoint& pt1, 
    const IntPoint& pt2, const IntPoint& pt3, double distSqrd)
{
  //this function is more accurate when the point that's geometrically
  //between the other 2 points is the one that's tested for distance.
  //ie makes it more likely to pick up 'spikes' ...
	if (Abs(pt1.X - pt2.X) > Abs(pt1.Y - pt2.Y))
	{
    if ((pt1.X > pt2.X) == (pt1.X < pt3.X))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.X > pt1.X) == (pt2.X < pt3.X))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
	    return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
	else
	{
    if ((pt1.Y > pt2.Y) == (pt1.Y < pt3.Y))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.Y > pt1.Y) == (pt2.Y < pt3.Y))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
      return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
}